

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

optional<unsigned_int>
slang::ast::evalEffectiveWidth(ASTContext *context,Expression *expr,TokenKind keyword)

{
  bitwidth_t bVar1;
  _Optional_payload_base<unsigned_int> _Var2;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar3;
  ulong uVar4;
  ulong uVar5;
  ConstantValue cv;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  _Stack_48;
  
  ASTContext::tryEval((ConstantValue *)&_Stack_48,context,expr);
  _Var2 = (_Optional_payload_base<unsigned_int>)
          ConstantValue::getEffectiveWidth((ConstantValue *)&_Stack_48);
  if (((ulong)_Var2 >> 0x20 & 1) == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0x100000000;
    if (keyword == CaseZKeyword) {
      pvVar3 = std::
               get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                         ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&_Stack_48);
      bVar1 = SVInt::countLeadingZs(pvVar3);
    }
    else {
      if (keyword != CaseXKeyword) {
        uVar5 = (ulong)_Var2 & 0xffffff0000000000;
        uVar4 = (ulong)_Var2 & 0xff00000000;
        goto LAB_004dbb0f;
      }
      pvVar3 = std::
               get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                         ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&_Stack_48);
      bVar1 = SVInt::countLeadingUnknowns(pvVar3);
    }
    _Var2._M_payload = _Var2._M_payload._M_value - bVar1;
    _Var2._4_4_ = 0;
  }
  uVar5 = 0;
LAB_004dbb0f:
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&_Stack_48);
  return (optional<unsigned_int>)((ulong)_Var2 & 0xffffffff | uVar4 | uVar5);
}

Assistant:

static std::optional<bitwidth_t> evalEffectiveWidth(const ASTContext& context,
                                                    const Expression& expr, TokenKind keyword) {
    auto cv = context.tryEval(expr);
    auto width = cv.getEffectiveWidth();
    if (!width)
        return std::nullopt;

    // If the case statement we are evaluating allows wildcards,
    // don't count a wildcard in a top bit as part of the effective
    // width, since it can match zeros.
    if (keyword == TokenKind::CaseXKeyword)
        return *width - cv.integer().countLeadingUnknowns();
    if (keyword == TokenKind::CaseZKeyword)
        return *width - cv.integer().countLeadingZs();
    return width;
}